

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::BuildMaterialIndices(ASEImporter *this)

{
  uint *puVar1;
  Material *mat;
  aiMesh *paVar2;
  long lVar3;
  pointer pMVar4;
  aiMaterial **ppaVar5;
  aiColor4D *paVar6;
  uint uVar7;
  ulong uVar8;
  aiColor4D *paVar9;
  ulong uVar10;
  ulong uVar11;
  aiScene *paVar12;
  pointer pMVar13;
  bool bVar14;
  
  if (this->pcScene == (aiScene *)0x0) {
    __assert_fail("__null != pcScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                  ,0x4cb,"void Assimp::ASEImporter::BuildMaterialIndices()");
  }
  pMVar4 = (this->mParser->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->mParser->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    uVar11 = 0;
    do {
      mat = pMVar4 + uVar11;
      if (pMVar4[uVar11].bNeed == true) {
        ConvertMaterial(this,mat);
        puVar1 = &this->pcScene->mNumMaterials;
        *puVar1 = *puVar1 + 1;
      }
      pMVar4 = (mat->avSubMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((mat->avSubMaterials).
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
          super__Vector_impl_data._M_finish != pMVar4) {
        uVar8 = 0;
        uVar10 = 1;
        do {
          if (pMVar4[uVar8].bNeed == true) {
            ConvertMaterial(this,pMVar4 + uVar8);
            puVar1 = &this->pcScene->mNumMaterials;
            *puVar1 = *puVar1 + 1;
          }
          pMVar4 = (mat->avSubMaterials).
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(mat->avSubMaterials).
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 5) *
                  -0x2c8590b21642c859;
          bVar14 = uVar10 <= uVar8;
          lVar3 = uVar8 - uVar10;
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar14 && lVar3 != 0);
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pMVar4 = (this->mParser->m_vMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->mParser->m_vMaterials).
                     super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 5) *
              -0x2c8590b21642c859;
    } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
  }
  paVar12 = this->pcScene;
  ppaVar5 = (aiMaterial **)operator_new__((ulong)paVar12->mNumMaterials << 3);
  paVar12->mMaterials = ppaVar5;
  pMVar4 = (this->mParser->m_vMaterials).
           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->mParser->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar4) {
    paVar6 = (aiColor4D *)0x0;
    uVar7 = 0;
    do {
      if (pMVar4[(long)paVar6].bNeed == true) {
        if (pMVar4[(long)paVar6].pcInstance == (aiMaterial *)0x0) {
          __assert_fail("__null != mat.pcInstance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                        ,0x4ea,"void Assimp::ASEImporter::BuildMaterialIndices()");
        }
        this->pcScene->mMaterials[uVar7] = pMVar4[(long)paVar6].pcInstance;
        paVar12 = this->pcScene;
        if (paVar12->mNumMeshes != 0) {
          uVar11 = 0;
          do {
            paVar2 = paVar12->mMeshes[uVar11];
            if ((paVar2->mMaterialIndex == 0xffffffff) && (paVar6 == paVar2->mColors[3])) {
              paVar2->mMaterialIndex = uVar7;
              paVar2->mColors[3] = (aiColor4D *)0x0;
            }
            uVar11 = uVar11 + 1;
            paVar12 = this->pcScene;
          } while (uVar11 < paVar12->mNumMeshes);
        }
        uVar7 = uVar7 + 1;
      }
      pMVar13 = pMVar4[(long)paVar6].avSubMaterials.
                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pMVar4[(long)paVar6].avSubMaterials.
          super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
          super__Vector_impl_data._M_finish != pMVar13) {
        uVar11 = 0;
        do {
          if (pMVar13[uVar11].bNeed == true) {
            if (pMVar13[uVar11].pcInstance == (aiMaterial *)0x0) {
              __assert_fail("__null != submat.pcInstance",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                            ,0x501,"void Assimp::ASEImporter::BuildMaterialIndices()");
            }
            this->pcScene->mMaterials[uVar7] = pMVar13[uVar11].pcInstance;
            paVar12 = this->pcScene;
            if (paVar12->mNumMeshes != 0) {
              uVar8 = 0;
              do {
                paVar2 = paVar12->mMeshes[uVar8];
                if (((uint)uVar11 == paVar2->mMaterialIndex) && (paVar6 == paVar2->mColors[3])) {
                  paVar2->mMaterialIndex = uVar7;
                  paVar2->mColors[3] = (aiColor4D *)0x0;
                }
                uVar8 = uVar8 + 1;
                paVar12 = this->pcScene;
              } while (uVar8 < paVar12->mNumMeshes);
            }
            uVar7 = uVar7 + 1;
          }
          uVar11 = (ulong)((uint)uVar11 + 1);
          pMVar13 = pMVar4[(long)paVar6].avSubMaterials.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)pMVar4[(long)paVar6].avSubMaterials.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar13 >> 5) *
                  -0x2c8590b21642c859;
        } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
      }
      paVar6 = (aiColor4D *)(ulong)((int)paVar6 + 1);
      pMVar4 = (this->mParser->m_vMaterials).
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar9 = (aiColor4D *)
               (((long)(this->mParser->m_vMaterials).
                       super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 5) *
               -0x2c8590b21642c859);
    } while (paVar6 <= paVar9 && (long)paVar9 - (long)paVar6 != 0);
  }
  return;
}

Assistant:

void ASEImporter::BuildMaterialIndices()
{
    ai_assert(NULL != pcScene);

    // iterate through all materials and check whether we need them
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat)
    {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)  {
            // Convert it to the aiMaterial layout
            ConvertMaterial(mat);
            ++pcScene->mNumMaterials;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)
        {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                // Convert it to the aiMaterial layout
                ConvertMaterial(submat);
                ++pcScene->mNumMaterials;
            }
        }
    }

    // allocate the output material array
    pcScene->mMaterials = new aiMaterial*[pcScene->mNumMaterials];
    D3DS::Material** pcIntMaterials = new D3DS::Material*[pcScene->mNumMaterials];

    unsigned int iNum = 0;
    for (unsigned int iMat = 0; iMat < mParser->m_vMaterials.size();++iMat) {
        ASE::Material& mat = mParser->m_vMaterials[iMat];
        if (mat.bNeed)
        {
            ai_assert(NULL != mat.pcInstance);
            pcScene->mMaterials[iNum] = mat.pcInstance;

            // Store the internal material, too
            pcIntMaterials[iNum] = &mat;

            // Iterate through all meshes and search for one which is using
            // this top-level material index
            for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)
            {
                aiMesh* mesh = pcScene->mMeshes[iMesh];
                if (ASE::Face::DEFAULT_MATINDEX == mesh->mMaterialIndex &&
                    iMat == (uintptr_t)mesh->mColors[3])
                {
                    mesh->mMaterialIndex = iNum;
                    mesh->mColors[3] = NULL;
                }
            }
            iNum++;
        }
        for (unsigned int iSubMat = 0; iSubMat < mat.avSubMaterials.size();++iSubMat)   {
            ASE::Material& submat = mat.avSubMaterials[iSubMat];
            if (submat.bNeed)   {
                ai_assert(NULL != submat.pcInstance);
                pcScene->mMaterials[iNum] = submat.pcInstance;

                // Store the internal material, too
                pcIntMaterials[iNum] = &submat;

                // Iterate through all meshes and search for one which is using
                // this sub-level material index
                for (unsigned int iMesh = 0; iMesh < pcScene->mNumMeshes;++iMesh)   {
                    aiMesh* mesh = pcScene->mMeshes[iMesh];

                    if (iSubMat == mesh->mMaterialIndex && iMat == (uintptr_t)mesh->mColors[3]) {
                        mesh->mMaterialIndex = iNum;
                        mesh->mColors[3]     = NULL;
                    }
                }
                iNum++;
            }
        }
    }

    // Delete our temporary array
    delete[] pcIntMaterials;
}